

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mpi_bigendian_to_host(mbedtls_mpi_uint *p,size_t limbs)

{
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  mbedtls_mpi_uint tmp;
  mbedtls_mpi_uint *cur_limb_right;
  mbedtls_mpi_uint *cur_limb_left;
  size_t limbs_local;
  mbedtls_mpi_uint *p_local;
  
  if (limbs != 0) {
    tmp = (mbedtls_mpi_uint)(p + (limbs - 1));
    for (cur_limb_right = p; cur_limb_right <= tmp; cur_limb_right = cur_limb_right + 1) {
      mVar1 = mpi_uint_bigendian_to_host(*cur_limb_right);
      mVar2 = mpi_uint_bigendian_to_host(*(mbedtls_mpi_uint *)tmp);
      *cur_limb_right = mVar2;
      *(mbedtls_mpi_uint *)tmp = mVar1;
      tmp = tmp - 8;
    }
  }
  return;
}

Assistant:

static void mpi_bigendian_to_host( mbedtls_mpi_uint * const p, size_t limbs )
{
    mbedtls_mpi_uint *cur_limb_left;
    mbedtls_mpi_uint *cur_limb_right;
    if( limbs == 0 )
        return;

    /*
     * Traverse limbs and
     * - adapt byte-order in each limb
     * - swap the limbs themselves.
     * For that, simultaneously traverse the limbs from left to right
     * and from right to left, as long as the left index is not bigger
     * than the right index (it's not a problem if limbs is odd and the
     * indices coincide in the last iteration).
     */
    for( cur_limb_left = p, cur_limb_right = p + ( limbs - 1 );
         cur_limb_left <= cur_limb_right;
         cur_limb_left++, cur_limb_right-- )
    {
        mbedtls_mpi_uint tmp;
        /* Note that if cur_limb_left == cur_limb_right,
         * this code effectively swaps the bytes only once. */
        tmp             = mpi_uint_bigendian_to_host( *cur_limb_left  );
        *cur_limb_left  = mpi_uint_bigendian_to_host( *cur_limb_right );
        *cur_limb_right = tmp;
    }
}